

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uuid.cpp
# Opt level: O2

ostream * pstore::operator<<(ostream *stream,version_type version)

{
  ostream *poVar1;
  
  if (version - time_based < 6) {
    poVar1 = std::operator<<(stream,&DAT_0013d308 +
                                    *(int *)(&DAT_0013d308 + (ulong)(version - time_based) * 4));
    return poVar1;
  }
  poVar1 = std::operator<<(stream,"");
  return poVar1;
}

Assistant:

std::ostream & operator<< (std::ostream & stream, uuid::version_type const version) {
        char const * str = "";
        switch (version) {
        case uuid::version_type::time_based: str = "time_based"; break;
        case uuid::version_type::dce_security: str = "dce_security"; break;
        case uuid::version_type::name_based_md5: str = "name_based_md5"; break;
        case uuid::version_type::random_number_based: str = "random_number_based"; break;
        case uuid::version_type::name_based_sha1: str = "name_based_sha1"; break;
        case uuid::version_type::unknown: str = "unknown"; break;
        }
        return stream << str;
    }